

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

mg_dns_resource_record *
mg_dns_next_record(mg_dns_message *msg,int query,mg_dns_resource_record *prev)

{
  mg_dns_resource_record *local_38;
  mg_dns_resource_record *local_30;
  mg_dns_resource_record *rr;
  mg_dns_resource_record *prev_local;
  int query_local;
  mg_dns_message *msg_local;
  
  if (prev == (mg_dns_resource_record *)0x0) {
    local_38 = msg->answers;
  }
  else {
    local_38 = prev + 1;
  }
  local_30 = local_38;
  while( true ) {
    if ((long)msg->num_answers <= ((long)local_30 - (long)msg->answers) / 0x30) {
      return (mg_dns_resource_record *)0x0;
    }
    if (local_30->rtype == query) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

struct mg_dns_resource_record *mg_dns_next_record(
        struct mg_dns_message *msg, int query,
        struct mg_dns_resource_record *prev) {
    struct mg_dns_resource_record *rr;

    for (rr = (prev == NULL ? msg->answers : prev + 1);
         rr - msg->answers < msg->num_answers; rr++) {
        if (rr->rtype == query) {
            return rr;
        }
    }
    return NULL;
}